

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

void __thiscall
embree::LineSegments::interpolate_impl<4>(LineSegments *this,RTCInterpolateArguments *args)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  float *pfVar8;
  BufferView<embree::Vec3fx> *pBVar9;
  char *pcVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  
  uVar5 = args->valueCount;
  if ((ulong)uVar5 != 0) {
    pfVar7 = args->P;
    pfVar8 = args->dPdu;
    pBVar9 = (&this->vertices)[(ulong)(args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) * 2].
             items;
    pcVar10 = pBVar9[args->bufferSlot].super_RawBufferView.ptr_ofs;
    uVar21 = (ulong)(uint)pBVar9[args->bufferSlot].super_RawBufferView.stride;
    pfVar11 = args->ddPdudu;
    uVar6 = args->primID;
    fVar4 = args->u;
    uVar20 = 0;
    do {
      uVar18 = (ulong)*(uint *)(*(long *)&(this->super_Geometry).field_0x58 +
                               *(long *)&this->field_0x68 * (ulong)uVar6);
      uVar19 = (uint)uVar20;
      uVar22 = -(uint)((int)uVar19 < (int)uVar5);
      uVar23 = -(uint)((int)(uVar19 | 1) < (int)uVar5);
      uVar24 = -(uint)((int)(uVar19 | 2) < (int)uVar5);
      uVar25 = -(uint)((int)(uVar19 | 3) < (int)uVar5);
      puVar1 = (uint *)(pcVar10 + uVar20 * 4 + uVar21 * uVar18);
      fVar26 = (float)(*puVar1 & uVar22);
      fVar27 = (float)(puVar1[1] & uVar23);
      fVar28 = (float)(puVar1[2] & uVar24);
      fVar29 = (float)(puVar1[3] & uVar25);
      puVar1 = (uint *)(pcVar10 + uVar20 * 4 + (uVar18 + 1) * uVar21);
      uVar19 = *puVar1;
      uVar15 = puVar1[1];
      uVar16 = puVar1[2];
      uVar17 = puVar1[3];
      if (pfVar7 != (float *)0x0) {
        pfVar2 = pfVar7 + uVar20;
        fVar12 = pfVar2[1];
        fVar13 = pfVar2[2];
        fVar14 = pfVar2[3];
        pfVar3 = pfVar7 + uVar20;
        *pfVar3 = (float)((uint)(((float)(uVar19 & uVar22) - fVar26) * fVar4 + fVar26) & uVar22 |
                         ~uVar22 & (uint)*pfVar2);
        pfVar3[1] = (float)((uint)(((float)(uVar15 & uVar23) - fVar27) * fVar4 + fVar27) & uVar23 |
                           ~uVar23 & (uint)fVar12);
        pfVar3[2] = (float)((uint)(((float)(uVar16 & uVar24) - fVar28) * fVar4 + fVar28) & uVar24 |
                           ~uVar24 & (uint)fVar13);
        pfVar3[3] = (float)((uint)(((float)(uVar17 & uVar25) - fVar29) * fVar4 + fVar29) & uVar25 |
                           ~uVar25 & (uint)fVar14);
      }
      if (pfVar8 != (float *)0x0) {
        pfVar2 = pfVar8 + uVar20;
        fVar12 = pfVar2[1];
        fVar13 = pfVar2[2];
        fVar14 = pfVar2[3];
        pfVar3 = pfVar8 + uVar20;
        *pfVar3 = (float)((uint)((float)(uVar19 & uVar22) - fVar26) & uVar22 |
                         ~uVar22 & (uint)*pfVar2);
        pfVar3[1] = (float)((uint)((float)(uVar15 & uVar23) - fVar27) & uVar23 |
                           ~uVar23 & (uint)fVar12);
        pfVar3[2] = (float)((uint)((float)(uVar16 & uVar24) - fVar28) & uVar24 |
                           ~uVar24 & (uint)fVar13);
        pfVar3[3] = (float)((uint)((float)(uVar17 & uVar25) - fVar29) & uVar25 |
                           ~uVar25 & (uint)fVar14);
      }
      if (pfVar11 != (float *)0x0) {
        pfVar2 = pfVar8 + uVar20;
        fVar26 = pfVar2[1];
        fVar27 = pfVar2[2];
        fVar28 = pfVar2[3];
        pfVar3 = pfVar8 + uVar20;
        *pfVar3 = (float)(~uVar22 & (uint)*pfVar2);
        pfVar3[1] = (float)(~uVar23 & (uint)fVar26);
        pfVar3[2] = (float)(~uVar24 & (uint)fVar27);
        pfVar3[3] = (float)(~uVar25 & (uint)fVar28);
      }
      uVar20 = uVar20 + 4;
    } while (uVar20 < uVar5);
  }
  return;
}

Assistant:

void interpolate_impl(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* ddPdudu = args->ddPdudu;
      unsigned int valueCount = args->valueCount;
      
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < numTimeSteps) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot <= vertexAttribs.size()));
      const char* src = nullptr;
      size_t stride = 0;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
      } else {
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
      }
      
      for (unsigned int i=0; i<valueCount; i+=N)
      {
        const size_t ofs = i*sizeof(float);
        const size_t segment = segments[primID];
        const vbool<N> valid = vint<N>((int)i)+vint<N>(step) < vint<N>(int(valueCount));
        const vfloat<N> p0 = mem<vfloat<N>>::loadu(valid,(float*)&src[(segment+0)*stride+ofs]);
        const vfloat<N> p1 = mem<vfloat<N>>::loadu(valid,(float*)&src[(segment+1)*stride+ofs]);
        if (P      ) mem<vfloat<N>>::storeu(valid,P+i,lerp(p0,p1,u));
        if (dPdu   ) mem<vfloat<N>>::storeu(valid,dPdu+i,p1-p0);
        if (ddPdudu) mem<vfloat<N>>::storeu(valid,dPdu+i,vfloat<N>(zero));
      }
    }